

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool __thiscall mkvparser::Tags::ExpandTagsArray(Tags *this)

{
  Tag *pTVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  Tag *this_00;
  ulong uVar6;
  Tag *local_a8;
  Tag *local_80;
  int local_74;
  int local_68;
  int idx;
  Tag *tags;
  int size;
  Tags *this_local;
  
  if (this->m_tags_count < this->m_tags_size) {
    this_local._7_1_ = true;
  }
  else {
    if (this->m_tags_size == 0) {
      local_74 = 1;
    }
    else {
      local_74 = this->m_tags_size << 1;
    }
    uVar3 = (ulong)local_74;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar3;
    uVar4 = SUB168(auVar2 * ZEXT816(0x10),0);
    uVar6 = uVar4 + 8;
    if (SUB168(auVar2 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar4) {
      uVar6 = 0xffffffffffffffff;
    }
    puVar5 = (ulong *)operator_new__(uVar6,(nothrow_t *)&std::nothrow);
    local_80 = (Tag *)0x0;
    if (puVar5 != (ulong *)0x0) {
      *puVar5 = uVar3;
      local_80 = (Tag *)(puVar5 + 1);
      if (uVar3 != 0) {
        local_a8 = local_80;
        do {
          Tag::Tag(local_a8);
          local_a8 = local_a8 + 1;
        } while (local_a8 != local_80 + uVar3);
      }
    }
    if (local_80 == (Tag *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      for (local_68 = 0; local_68 < this->m_tags_count; local_68 = local_68 + 1) {
        Tag::ShallowCopy(this->m_tags + local_68,local_80 + local_68);
      }
      pTVar1 = this->m_tags;
      if (pTVar1 != (Tag *)0x0) {
        this_00 = pTVar1 + *(long *)&pTVar1[-1].m_simple_tags_size;
        while (pTVar1 != this_00) {
          this_00 = this_00 + -1;
          Tag::~Tag(this_00);
        }
        operator_delete__(&pTVar1[-1].m_simple_tags_size);
      }
      this->m_tags = local_80;
      this->m_tags_size = local_74;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Tags::ExpandTagsArray() {
  if (m_tags_size > m_tags_count)
    return true;  // nothing else to do

  const int size = (m_tags_size == 0) ? 1 : 2 * m_tags_size;

  Tag* const tags = new (std::nothrow) Tag[size];

  if (tags == NULL)
    return false;

  for (int idx = 0; idx < m_tags_count; ++idx) {
    m_tags[idx].ShallowCopy(tags[idx]);
  }

  delete[] m_tags;
  m_tags = tags;

  m_tags_size = size;
  return true;
}